

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_PartialEquivalencyNotEqualTest_Test::
TestBody(MessageDifferencerTest_PartialEquivalencyNotEqualTest_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_880;
  AssertHelper local_878;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  TestAllTypes msg2;
  TestAllTypes msg1;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&msg1);
  proto2_unittest::TestAllTypes::TestAllTypes(&msg2);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&msg1);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&msg2);
  msg1.field_0._impl_.optional_int32_ = 0;
  msg1.field_0._impl_._has_bits_.has_bits_[0]._1_1_ =
       msg1.field_0._impl_._has_bits_.has_bits_[0]._1_1_ | 0x10;
  msg2.field_0._impl_.optional_int32_ = 0;
  msg2.field_0._impl_._has_bits_.has_bits_[0]._1_1_ =
       msg2.field_0._impl_._has_bits_.has_bits_[0]._1_1_ & 0xef;
  bVar1 = util::MessageDifferencer::Equals(&msg1.super_Message,&msg2.super_Message);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&differencer,(internal *)&gtest_ar_,
               (AssertionResult *)"util::MessageDifferencer::Equals(msg1, msg2)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x30e,(char *)differencer.reporter_);
    testing::internal::AssertHelper::operator=(&local_880,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_880);
    std::__cxx11::string::~string((string *)&differencer);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  util::MessageDifferencer::set_message_field_comparison(&differencer,EQUIVALENT);
  util::MessageDifferencer::set_scope(&differencer,PARTIAL);
  gtest_ar__1.success_ =
       util::MessageDifferencer::Compare(&differencer,&msg1.super_Message,&msg2.super_Message);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&local_880);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)0xf0d901,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x313,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_878,(Message *)&local_880);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (local_880.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_880.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestAllTypes::~TestAllTypes(&msg2);
  proto2_unittest::TestAllTypes::~TestAllTypes(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, PartialEquivalencyNotEqualTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  msg1.set_optional_int32(0);
  msg2.clear_optional_int32();

  // Compare
  EXPECT_FALSE(util::MessageDifferencer::Equals(msg1, msg2));
  util::MessageDifferencer differencer;
  differencer.set_message_field_comparison(
      util::MessageDifferencer::EQUIVALENT);
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}